

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

void __thiscall
helics::apps::Echo::Echo(Echo *this,string_view name,CoreApp *core,FederateInfo *fedInfo)

{
  CoreApp *in_RDX;
  FederateInfo *in_RSI;
  undefined8 *in_RDI;
  App *unaff_retaddr;
  string_view in_stack_00000008;
  Echo *this_00;
  
  App::App(unaff_retaddr,in_stack_00000008,in_RDX,in_RSI);
  *in_RDI = &PTR__Echo_009be2c8;
  this_00 = (Echo *)(in_RDI + 0x14);
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x2338cc);
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  CLI::std::mutex::mutex((mutex *)0x2338f4);
  initialSetup(this_00);
  return;
}

Assistant:

Echo::Echo(std::string_view name, CoreApp& core, const FederateInfo& fedInfo):
        App(name, core, fedInfo)
    {
        initialSetup();
    }